

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O0

void __thiscall sjtu::UserManager::modify_profile(UserManager *this,int argc,string *argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  __type _Var5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  ostream *poVar9;
  void *pvVar10;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  pair<long,_bool> pVar11;
  userType *user;
  bool cur_is_online;
  int cur_privilege;
  userType *cur;
  pair<long,_bool> tmp2;
  pair<long,_bool> tmp1;
  int i;
  int upri;
  string curname;
  string umail;
  string uname;
  string uspass;
  string usname;
  size_t *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  StringHasher *in_stack_fffffffffffffdc0;
  unsigned_long_long *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  string local_168 [32];
  hashType local_148;
  long local_140;
  byte local_138;
  long local_130;
  undefined1 local_128;
  string local_120 [32];
  hashType local_100;
  long local_f8;
  byte local_f0;
  int local_e8;
  int local_e4;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::string::string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",&local_b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::string(local_e0);
  local_e4 = -1;
  for (local_e8 = 0; local_e8 < local_c; local_e8 = local_e8 + 2) {
    bVar4 = std::operator==(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
    if (bVar4) {
      std::__cxx11::string::operator=(local_38,(string *)((long)local_e8 * 0x20 + 0x20 + local_18));
    }
    else {
      bVar4 = std::operator==(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
      if (bVar4) {
        std::__cxx11::string::operator=
                  (local_58,(string *)((long)local_e8 * 0x20 + 0x20 + local_18));
      }
      else {
        bVar4 = std::operator==(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
        if (bVar4) {
          std::__cxx11::string::operator=
                    (local_90,(string *)((long)local_e8 * 0x20 + 0x20 + local_18));
        }
        else {
          bVar4 = std::operator==(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
          if (bVar4) {
            std::__cxx11::string::operator=
                      (local_b8,(string *)((long)local_e8 * 0x20 + 0x20 + local_18));
          }
          else {
            bVar4 = std::operator==(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
            if (bVar4) {
              std::__cxx11::string::operator=
                        (local_e0,(string *)((long)local_e8 * 0x20 + 0x20 + local_18));
            }
            else {
              bVar4 = std::operator==(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
              if (bVar4) {
                local_e4 = std::__cxx11::stoi(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,0)
                ;
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::string(local_120,local_e0);
  local_100 = StringHasher::operator()(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  pVar11 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     ((BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
                      CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                      in_stack_fffffffffffffe08);
  local_130 = pVar11.first;
  local_128 = pVar11.second;
  local_f8 = local_130;
  local_f0 = local_128;
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::string(local_168,local_38);
  local_148 = StringHasher::operator()(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  pVar11 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     ((BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
                      CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                      in_stack_fffffffffffffe08);
  local_140 = pVar11.first;
  local_138 = pVar11.second;
  std::__cxx11::string::~string(local_168);
  if (((local_f0 & 1) == 1) && ((local_138 & 1) == 1)) {
    lVar6 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))(*(long **)(in_RDI + 0x10),&local_f8);
    iVar1 = *(int *)(lVar6 + 0x68);
    iVar2 = *(int *)(lVar6 + 0x6c);
    iVar3 = *(int *)(in_RDI + 0x18);
    pcVar7 = (char *)(**(code **)(**(long **)(in_RDI + 0x10) + 0x10))
                               (*(long **)(in_RDI + 0x10),&local_140);
    if ((((*(int *)(pcVar7 + 0x68) < iVar1) ||
         (_Var5 = std::operator==(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8), _Var5)) &&
        (iVar2 == iVar3)) && (local_e4 < iVar1)) {
      bVar4 = std::operator!=(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
      if (bVar4) {
        pcVar8 = (char *)std::__cxx11::string::c_str();
        strcpy(pcVar7 + 0x15,pcVar8);
      }
      bVar4 = std::operator!=(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
      if (bVar4) {
        pcVar8 = (char *)std::__cxx11::string::c_str();
        strcpy(pcVar7 + 0x34,pcVar8);
      }
      bVar4 = std::operator!=(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
      if (bVar4) {
        pcVar8 = (char *)std::__cxx11::string::c_str();
        strcpy(pcVar7 + 0x49,pcVar8);
      }
      if (local_e4 != -1) {
        *(int *)(pcVar7 + 0x68) = local_e4;
      }
      (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))(*(long **)(in_RDI + 0x10),pcVar7 + 0x78);
      poVar9 = std::operator<<((ostream *)&std::cout,pcVar7);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar7 + 0x34);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar7 + 0x49);
      poVar9 = std::operator<<(poVar9," ");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,*(int *)(pcVar7 + 0x68));
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
    else {
      pvVar10 = (void *)std::ostream::operator<<(&std::cout,-1);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    pvVar10 = (void *)std::ostream::operator<<(&std::cout,-1);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void modify_profile(int argc, std::string *argv) {
            std::string usname, uspass = "", uname = "", umail = "", curname;
            int upri = -1;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") usname = argv[i + 1];
                else if (argv[i] == "-p") uspass = argv[i + 1];
                else if (argv[i] == "-n") uname = argv[i + 1];
                else if (argv[i] == "-m") umail = argv[i + 1];
                else if (argv[i] == "-c") curname = argv[i + 1];
                else if (argv[i] == "-g") upri = stoi(argv[i + 1]);
            }
            std::pair<locType, bool> tmp1 = UserBpTree->find(hasher(curname));
            std::pair<locType, bool> tmp2 = UserBpTree->find(hasher(usname));
            if (tmp1.second == true && tmp2.second == true) {
                userType *cur = UserFile->read(tmp1.first);
                int cur_privilege = cur->privilege;
                bool cur_is_online = cur->is_online == online_flag;
                userType *user = UserFile->read(tmp2.first);
                if ((cur_privilege > user->privilege || curname == usname) && cur_is_online == true &&
                    cur_privilege > upri) {
                    if (uspass != "") strcpy(user->password, uspass.c_str());
                    if (uname != "") strcpy(user->name, uname.c_str());;
                    if (umail != "") strcpy(user->mailAddr, umail.c_str());;
                    if (upri != -1) user->privilege = upri;
                    UserFile->save(user->offset);
                    std::cout << user->username << " " << user->name << " " << user->mailAddr << " " << user->privilege
                              << std::endl;
                } else std::cout << -1 << std::endl;
            } else std::cout << -1 << std::endl;
        }